

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcPipeline>::dispose
          (Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcPipeline> *this)

{
  RpcPipeline *object;
  RpcPipeline *ptrCopy;
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcPipeline> *this_local;
  
  object = this->ptr;
  if (object != (RpcPipeline *)0x0) {
    this->ptr = (RpcPipeline *)0x0;
    Disposer::dispose<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcPipeline>
              (this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }